

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

void encodeGrid(char *result,EncodeRec *enc,int m,int extraDigits,char headerLetter)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int dividery_00;
  int iVar7;
  TerritoryBoundary *pTVar8;
  undefined1 *puVar9;
  int nrchars;
  char t_1;
  int dify;
  int difx;
  char *resultptr;
  int extray;
  int extrax;
  int dividerx;
  int dividery;
  int iStack_5c;
  char t;
  int v;
  int relx;
  int x;
  int rely;
  int xgridsize;
  int ygridsize;
  int postlen;
  int prelen;
  int divy;
  int divx;
  int codexm;
  int orgcodex;
  TerritoryBoundary *b;
  char headerLetter_local;
  int extraDigits_local;
  int m_local;
  EncodeRec *enc_local;
  char *result_local;
  
  pTVar8 = TERRITORY_BOUNDARIES + m;
  iVar2 = coDex(m);
  if (iVar2 == 0x15) {
    divy = 0x16;
  }
  else {
    divy = iVar2;
    if (iVar2 == 0xe) {
      divy = 0x17;
    }
  }
  *result = '\0';
  enc_local = (EncodeRec *)result;
  if (headerLetter != '\0') {
    enc_local = (EncodeRec *)(result + 1);
  }
  iVar3 = divy / 10;
  nrchars = divy % 10;
  postlen = TERRITORY_BOUNDARIES[m].flags >> 0x10;
  if (postlen == 1) {
    prelen = X_SIDE[iVar3];
    postlen = Y_SIDE[iVar3];
  }
  else {
    prelen = NC[iVar3] / postlen;
  }
  iVar4 = ((TERRITORY_BOUNDARIES[m].maxy - TERRITORY_BOUNDARIES[m].miny) + postlen + -1) / postlen;
  iVar5 = ((TERRITORY_BOUNDARIES[m].maxx - pTVar8->minx) + prelen + -1) / prelen;
  v = (enc->coord32).lonMicroDeg;
  iStack_5c = v - pTVar8->minx;
  if (iStack_5c < 0) {
    iStack_5c = iStack_5c + 360000000;
    v = v + 360000000;
  }
  else if (359999999 < iStack_5c) {
    iStack_5c = iStack_5c + -360000000;
    v = v + -360000000;
  }
  iVar6 = ((enc->coord32).latMicroDeg - TERRITORY_BOUNDARIES[m].miny) / iVar4;
  iStack_5c = iStack_5c / iVar5;
  if ((iStack_5c < prelen) && (iVar6 < postlen)) {
    if ((prelen == postlen) || (iVar3 < 3)) {
      dividery = iStack_5c * postlen + ((postlen + -1) - iVar6);
    }
    else {
      dividery = encodeSixWide(iStack_5c,iVar6,prelen,postlen);
    }
    encodeBase31((char *)enc_local,dividery,iVar3);
    if (((iVar3 == 4) && (prelen == 0x3c1)) && (postlen == 0x3c1)) {
      uVar1 = *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 1);
      *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 1) =
           *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 2);
      *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 2) = uVar1;
    }
    dividery_00 = (iVar4 + Y_SIDE[nrchars] + -1) / Y_SIDE[nrchars];
    iVar7 = (iVar5 + X_SIDE[nrchars] + -1) / X_SIDE[nrchars];
    puVar9 = (undefined1 *)((long)&(enc_local->coord32).latMicroDeg + (long)iVar3);
    iVar3 = v - (pTVar8->minx + iStack_5c * iVar5);
    iVar4 = (enc->coord32).latMicroDeg - (TERRITORY_BOUNDARIES[m].miny + iVar6 * iVar4);
    *puVar9 = 0x2e;
    iVar5 = iVar3 / iVar7;
    iVar6 = (Y_SIDE[nrchars] + -1) - iVar4 / dividery_00;
    if (nrchars == 3) {
      encodeTriple(puVar9 + 1,iVar5,iVar6);
    }
    else {
      encodeBase31(puVar9 + 1,iVar5 * Y_SIDE[nrchars] + iVar6,nrchars);
      if (nrchars == 4) {
        uVar1 = puVar9[2];
        puVar9[2] = puVar9[3];
        puVar9[3] = uVar1;
      }
    }
    if (iVar2 == 0xe) {
      *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 2) =
           *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 1);
      *(undefined1 *)((long)&(enc_local->coord32).latMicroDeg + 1) = 0x2e;
    }
    encodeExtension((char *)enc_local,iVar3 % iVar7 << 2,iVar4 % dividery_00,iVar7 << 2,dividery_00,
                    extraDigits,1,enc);
    if (headerLetter != '\0') {
      *(char *)((long)&enc_local[-1].mapcodes + 7) = headerLetter;
    }
  }
  return;
}

Assistant:

static void encodeGrid(char *result, const EncodeRec *enc, const int m, const int extraDigits,
                       const char headerLetter) {
    const TerritoryBoundary *b = TERRITORY_BOUNDARY(m);
    const int orgcodex = coDex(m);
    int codexm;
    ASSERT(result);
    ASSERT(enc);
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));
    codexm = orgcodex;
    if (codexm == 21) {
        codexm = 22;
    } else if (codexm == 14) {
        codexm = 23;
    }

    *result = 0;
    if (headerLetter) {
        result++;
    }

    { // encode
        int divx, divy;
        const int prelen = codexm / 10;
        const int postlen = codexm % 10;

        divy = SMART_DIV(m);
        ASSERT(divy > 0);
        if (divy == 1) {
            divx = X_SIDE[prelen];
            divy = Y_SIDE[prelen];
        } else {
            divx = (NC[prelen] / divy);
        }

        { // grid
            const int ygridsize = (b->maxy - b->miny + divy - 1) / divy;
            const int xgridsize = (b->maxx - b->minx + divx - 1) / divx;
            int rely = enc->coord32.latMicroDeg - b->miny;
            int x = enc->coord32.lonMicroDeg;
            int relx = x - b->minx;

            if (relx < 0) {
                relx += 360000000;
                x += 360000000;
            } else if (relx >= 360000000) // 1.32 fix FIJI edge case
            {
                relx -= 360000000;
                x -= 360000000;
            }

            rely /= ygridsize;
            relx /= xgridsize;

            if (relx >= divx || rely >= divy) {
                return;
            }

            { // prefix
                int v;
                if (divx != divy && prelen > 2) {
                    v = encodeSixWide(relx, rely, divx, divy);
                } else {
                    v = relx * divy + (divy - 1 - rely);
                }
                encodeBase31(result, v, prelen);
            } // prefix

            if (prelen == 4 && divx == 961 && divy == 961) {
                const char t = result[1];
                result[1] = result[2];
                result[2] = t;
            }

            rely = b->miny + (rely * ygridsize);
            relx = b->minx + (relx * xgridsize);

            { // postfix
                const int dividery = ((ygridsize + Y_SIDE[postlen] - 1) / Y_SIDE[postlen]);
                const int dividerx = ((xgridsize + X_SIDE[postlen] - 1) / X_SIDE[postlen]);
                int extrax, extray;

                {
                    char *resultptr = result + prelen;


                    int difx = x - relx;
                    int dify = enc->coord32.latMicroDeg - rely;

                    *resultptr++ = '.';

                    extrax = difx % dividerx;
                    extray = dify % dividery;
                    difx /= dividerx;
                    dify /= dividery;


                    // reverse y-direction
                    dify = Y_SIDE[postlen] - 1 - dify;

                    if (postlen == 3) // encode special
                    {
                        encodeTriple(resultptr, difx, dify);
                    } else {
                        encodeBase31(resultptr, (difx) * Y_SIDE[postlen] + dify, postlen);
                        // swap 4-int codes for readability
                        if (postlen == 4) {
                            char t = resultptr[1];
                            resultptr[1] = resultptr[2];
                            resultptr[2] = t;
                        }
                    }
                }

                if (orgcodex == 14) {
                    result[2] = result[1];
                    result[1] = '.';
                }

                encodeExtension(result, extrax << 2, extray, dividerx << 2, dividery, extraDigits, 1, enc); // grid
                if (headerLetter) {
                    result--;
                    *result = headerLetter;
                }
            } // postfix
        } // grid
    }  // encode
}